

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat-macros.h
# Opt level: O0

void shift64RightJamming(uint64_t a,int count,uint64_t *zPtr)

{
  undefined8 local_28;
  uint64_t z;
  uint64_t *zPtr_local;
  int count_local;
  uint64_t a_local;
  
  local_28 = a;
  if (count != 0) {
    if (count < 0x40) {
      local_28 = a >> ((byte)count & 0x3f) | (long)(int)(uint)(a << (-(byte)count & 0x3f) != 0);
    }
    else {
      local_28 = (uint64_t)(int)(uint)(a != 0);
    }
  }
  *zPtr = local_28;
  return;
}

Assistant:

static inline void shift64RightJamming(uint64_t a, int count, uint64_t *zPtr)
{
    uint64_t z;

    if ( count == 0 ) {
        z = a;
    }
    else if ( count < 64 ) {
        z = ( a>>count ) | ( ( a<<( ( - count ) & 63 ) ) != 0 );
    }
    else {
        z = ( a != 0 );
    }
    *zPtr = z;

}